

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookbook.c
# Opt level: O1

void readtable(void)

{
  ulong uVar1;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  int status;
  fitsfile *fptr;
  float floatnull;
  int hdutype;
  char *ttype [3];
  long longnull;
  int anynull;
  int nfound;
  char strnull [10];
  char *name [6];
  float den [6];
  char filename [13];
  long dia [6];
  
  builtin_strncpy(filename + 8,".fit",5);
  builtin_strncpy(filename,"atestfil",8);
  status = 0;
  iVar2 = ffopentest(10,&fptr,filename,0,&status);
  if (iVar2 != 0) {
    printerror(status);
  }
  lVar6 = 0;
  do {
    pcVar3 = (char *)malloc(0x47);
    ttype[lVar6] = pcVar3;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  lVar6 = 0;
  do {
    pcVar3 = (char *)malloc(10);
    name[lVar6] = pcVar3;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 6);
  uVar5 = 2;
  do {
    iVar2 = ffmahd(fptr,uVar5,&hdutype,&status);
    if (iVar2 != 0) {
      printerror(status);
    }
    if (hdutype == 2) {
      pcVar3 = "\nReading binary table in HDU %d:\n";
LAB_00103246:
      printf(pcVar3,(ulong)uVar5);
    }
    else {
      if (hdutype == 1) {
        pcVar3 = "\nReading ASCII table in HDU %d:\n";
        goto LAB_00103246;
      }
      puts("Error: this HDU is not an ASCII or binary table");
      printerror(status);
    }
    ffgkns(fptr,"TTYPE",1,3,ttype,&nfound,&status);
    printf(" Row  %10s %10s %10s\n",ttype[0],ttype[1],ttype[2]);
    strnull[0] = ' ';
    strnull[1] = '\0';
    longnull = 0;
    floatnull = 0.0;
    ffgcv(fptr,0x10,1,1,1,6,strnull,name,&anynull,&status);
    ffgcv(fptr,0x29,2,1,1,6,&longnull,dia,&anynull,&status);
    ffgcv(fptr,0x2a,3,1,1,6,&floatnull,den,&anynull,&status);
    uVar4 = 0;
    do {
      uVar1 = uVar4 + 1;
      printf("%5d %10s %10ld %10.2f\n",(double)den[uVar4],uVar1 & 0xffffffff,name[uVar4],dia[uVar4])
      ;
      uVar4 = uVar1;
    } while (uVar1 != 6);
    uVar5 = uVar5 + 1;
    if (uVar5 == 4) {
      lVar6 = 0;
      do {
        free(ttype[lVar6]);
        lVar6 = lVar6 + 1;
      } while (lVar6 != 3);
      lVar6 = 0;
      do {
        free(name[lVar6]);
        lVar6 = lVar6 + 1;
      } while (lVar6 != 6);
      iVar2 = ffclos(fptr,&status);
      if (iVar2 != 0) {
        printerror(status);
      }
      return;
    }
  } while( true );
}

Assistant:

void readtable( void )

    /************************************************************/
    /* read and print data values from an ASCII or binary table */
    /************************************************************/
{
    fitsfile *fptr;       /* pointer to the FITS file, defined in fitsio.h */
    int status, hdunum, hdutype,  nfound, anynull, ii;
    long frow, felem, nelem, longnull, dia[6];
    float floatnull, den[6];
    char strnull[10], *name[6], *ttype[3]; 

    char filename[]  = "atestfil.fit";     /* name of existing FITS file   */

    status = 0;

    if ( fits_open_file(&fptr, filename, READONLY, &status) )
         printerror( status );

    for (ii = 0; ii < 3; ii++)      /* allocate space for the column labels */
        ttype[ii] = (char *) malloc(FLEN_VALUE);  /* max label length = 69 */

    for (ii = 0; ii < 6; ii++)    /* allocate space for string column value */
        name[ii] = (char *) malloc(10);   

    for (hdunum = 2; hdunum <= 3; hdunum++) /*read ASCII, then binary table */
    {
      /* move to the HDU */
      if ( fits_movabs_hdu(fptr, hdunum, &hdutype, &status) ) 
           printerror( status );

      if (hdutype == ASCII_TBL)
          printf("\nReading ASCII table in HDU %d:\n",  hdunum);
      else if (hdutype == BINARY_TBL)
          printf("\nReading binary table in HDU %d:\n", hdunum);
      else
      {
          printf("Error: this HDU is not an ASCII or binary table\n");
          printerror( status );
      }

      /* read the column names from the TTYPEn keywords */
      fits_read_keys_str(fptr, "TTYPE", 1, 3, ttype, &nfound, &status);

      printf(" Row  %10s %10s %10s\n", ttype[0], ttype[1], ttype[2]);

      frow      = 1;
      felem     = 1;
      nelem     = 6;
      strcpy(strnull, " ");
      longnull  = 0;
      floatnull = 0.;

      /*  read the columns */  
      fits_read_col(fptr, TSTRING, 1, frow, felem, nelem, strnull,  name,
                    &anynull, &status);
      fits_read_col(fptr, TLONG, 2, frow, felem, nelem, &longnull,  dia,
                    &anynull, &status);
      fits_read_col(fptr, TFLOAT, 3, frow, felem, nelem, &floatnull, den,
                    &anynull, &status);

      for (ii = 0; ii < 6; ii++)
        printf("%5d %10s %10ld %10.2f\n", ii + 1, name[ii], dia[ii], den[ii]);
    }

    for (ii = 0; ii < 3; ii++)      /* free the memory for the column labels */
        free( ttype[ii] );

    for (ii = 0; ii < 6; ii++)      /* free the memory for the string column */
        free( name[ii] );

    if ( fits_close_file(fptr, &status) ) 
         printerror( status );

    return;
}